

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

void __thiscall pybind11::function::function(function *this,object *o)

{
  int iVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (this->super_object).super_handle.m_ptr = (PyObject *)0x0;
  (this->super_object).super_handle.m_ptr = (o->super_handle).m_ptr;
  (o->super_handle).m_ptr = (PyObject *)0x0;
  if ((this->super_object).super_handle.m_ptr != (PyObject *)0x0) {
    iVar1 = PyCallable_Check();
    if (iVar1 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,((this->super_object).super_handle.m_ptr)->ob_type->tp_name,
                 (allocator<char> *)&local_50);
      std::operator+(&local_90,"Object of type \'",&local_70);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_50 = (long *)*plVar2;
      plVar3 = plVar2 + 2;
      if (local_50 == plVar3) {
        local_40 = *plVar3;
        lStack_38 = plVar2[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar3;
      }
      local_48 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_50);
      *(undefined ***)this_00 = &PTR__runtime_error_004c7bd8;
      __cxa_throw(this_00,&type_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

handle cpp_function() const {
        handle fun = detail::get_function(m_ptr);
        if (fun && PyCFunction_Check(fun.ptr()))
            return fun;
        return handle();
    }